

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSphereShape.cpp
# Opt level: O2

void __thiscall
btSphereShape::calculateLocalInertia(btSphereShape *this,btScalar mass,btVector3 *inertia)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float fVar1;
  
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])();
  (*(this->super_btConvexInternalShape).super_btConvexShape.super_btCollisionShape.
    _vptr_btCollisionShape[0xc])(this);
  fVar1 = extraout_XMM0_Da_00 * extraout_XMM0_Da * mass * 0.4;
  inertia->m_floats[0] = fVar1;
  inertia->m_floats[1] = fVar1;
  inertia->m_floats[2] = fVar1;
  inertia->m_floats[3] = 0.0;
  return;
}

Assistant:

void	btSphereShape::calculateLocalInertia(btScalar mass,btVector3& inertia) const
{
	btScalar elem = btScalar(0.4) * mass * getMargin()*getMargin();
	inertia.setValue(elem,elem,elem);

}